

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

void cppnet::GetFormatTime(char *buf,uint32_t *len,FormatTimeUnit unit)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  size_t __maxlen;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  tm time;
  time_t now_time_t;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  now_time_t = lVar2 / 1000000000;
  if (unit == FTU_MILLISECOND) {
    Localtime((uint64_t *)&now_time_t,&time);
    __maxlen = (size_t)*len;
    uVar3 = (ulong)(time.tm_year + 0x76c);
    uVar5 = (ulong)(time.tm_mon + 1);
    uVar6 = (ulong)(uint)time.tm_mday;
    uVar7 = (ulong)(uint)time.tm_hour;
    uVar8 = (ulong)(uint)time.tm_sec;
    uVar9 = (ulong)(uint)time.tm_min;
    pcVar4 = "%04d-%02d-%02d:%02d:%02d:%02d:%03d";
    goto LAB_00115314;
  }
  Localtime((uint64_t *)&now_time_t,&time);
  __maxlen = (size_t)*len;
  uVar3 = (ulong)(time.tm_year + 0x76c);
  switch(unit) {
  case FTU_YEAR:
    uVar1 = snprintf(buf,__maxlen,"%04d",uVar3);
    break;
  case FTU_MONTH:
    uVar1 = snprintf(buf,__maxlen,"%04d-%02d",uVar3,(ulong)(time.tm_mon + 1));
    break;
  case FTU_DAY:
    uVar1 = snprintf(buf,__maxlen,"%04d-%02d-%02d",uVar3,(ulong)(time.tm_mon + 1),
                     (ulong)(uint)time.tm_mday);
    break;
  case FTU_HOUR:
    pcVar4 = "%04d-%02d-%02d:%02d";
    goto LAB_001153ef;
  case FTU_MINUTE:
    pcVar4 = "%04d-%02d-%02d:%02d:%02d";
LAB_001153ef:
    uVar1 = snprintf(buf,__maxlen,pcVar4,uVar3,(ulong)(time.tm_mon + 1),(ulong)(uint)time.tm_mday,
                     (ulong)(uint)time.tm_hour);
    break;
  case FTU_SECOND:
    uVar5 = (ulong)(time.tm_mon + 1);
    uVar6 = (ulong)(uint)time.tm_mday;
    uVar7 = (ulong)(uint)time.tm_hour;
    uVar8 = (ulong)(uint)time.tm_sec;
    uVar9 = (ulong)(uint)time.tm_min;
    pcVar4 = "%04d-%02d-%02d:%02d:%02d:%02d";
    goto LAB_00115314;
  default:
    uVar5 = (ulong)(time.tm_mon + 1);
    uVar6 = (ulong)(uint)time.tm_mday;
    uVar7 = (ulong)(uint)time.tm_hour;
    uVar8 = (ulong)(uint)time.tm_sec;
    uVar9 = (ulong)(uint)time.tm_min;
    pcVar4 = "%04d-%02d-%02d:%02d:%02d:%02d:%03d";
LAB_00115314:
    uVar1 = snprintf(buf,__maxlen,pcVar4,uVar3,uVar5,uVar6,uVar7,uVar9,uVar8);
  }
  *len = uVar1;
  return;
}

Assistant:

void GetFormatTime(char* buf, uint32_t& len, FormatTimeUnit unit) {
    auto now_time = std::chrono::system_clock::now();
    auto now_time_t = std::chrono::system_clock::to_time_t(now_time);
    
    int32_t millisecond = 0;
    if (unit == FTU_MILLISECOND) {
        auto msec = std::chrono::duration_cast<std::chrono::milliseconds>(now_time.time_since_epoch()).count();
        auto sec = std::chrono::duration_cast<std::chrono::seconds>(now_time.time_since_epoch()).count();
        millisecond = (int32_t)(msec - (sec * 1000));
    }
    
    tm time;
    Localtime((uint64_t*)&now_time_t, (void*)&time);
    switch (unit)
    {
    case FTU_MILLISECOND:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d:%02d:%03d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min, time.tm_sec, millisecond);
        break;
    case FTU_SECOND:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d:%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min, time.tm_sec);
        break;
    case FTU_MINUTE:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min);
        break;
    case FTU_HOUR:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour);
        break;
    case FTU_DAY:
        len = snprintf(buf, len, "%04d-%02d-%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday);
        break;
    case FTU_MONTH:
        len = snprintf(buf, len, "%04d-%02d", 1900 + time.tm_year,  1 + time.tm_mon);
        break;
    case FTU_YEAR:
        len = snprintf(buf, len, "%04d", 1900 + time.tm_year);
        break;
    default:
        // default FTU_MILLISECOND
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d:%02d:%03d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min, time.tm_sec, millisecond);
        break;
    }
}